

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint64_t absl::hash_internal::MixingHashState::CombineContiguousImpl
                   (uint64_t state,uchar *first,ulong len)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  size_t sVar3;
  uint64_t uVar4;
  ulong local_58;
  uint64_t v;
  size_t len_local;
  uchar *first_local;
  uint64_t state_local;
  MultType m;
  
  if (len < 9) {
    if (len < 4) {
      if (len == 0) {
        return state;
      }
      uVar2 = Read1To3(first,len);
      local_58 = (ulong)uVar2;
    }
    else {
      local_58 = Read4To8(first,len);
    }
  }
  else {
    sVar3 = PiecewiseChunkSize();
    if (sVar3 < len) {
      uVar4 = CombineLargeContiguousImpl32(state,first,len);
      return uVar4;
    }
    uVar2 = CityHash32((char *)first,len);
    local_58 = (ulong)uVar2;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = state + local_58;
  return SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),0) ^
         SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),8);
}

Assistant:

inline uint64_t MixingHashState::CombineContiguousImpl(
    uint64_t state, const unsigned char* first, size_t len,
    std::integral_constant<int, 4> /* sizeof_size_t */) {
  // For large values we use CityHash, for small ones we just use a
  // multiplicative hash.
  uint64_t v;
  if (len > 8) {
    if (ABSL_PREDICT_FALSE(len > PiecewiseChunkSize())) {
      return CombineLargeContiguousImpl32(state, first, len);
    }
    v = hash_internal::CityHash32(reinterpret_cast<const char*>(first), len);
  } else if (len >= 4) {
    v = Read4To8(first, len);
  } else if (len > 0) {
    v = Read1To3(first, len);
  } else {
    // Empty ranges have no effect.
    return state;
  }
  return Mix(state, v);
}